

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall sznet::net::Buffer::wrapBuffer(Buffer *this)

{
  size_t sVar1;
  pointer pcVar2;
  size_t __n;
  
  sVar1 = this->m_readerIndex;
  if (sVar1 != this->m_nCheapPrepend) {
    pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n = this->m_writerIndex - sVar1;
    memmove(pcVar2 + this->m_nCheapPrepend,pcVar2 + sVar1,__n);
    this->m_readerIndex = this->m_nCheapPrepend;
    this->m_writerIndex = __n + this->m_nCheapPrepend;
  }
  return;
}

Assistant:

void wrapBuffer()
	{
		if (m_readerIndex == m_nCheapPrepend)
		{
			return;
		}

		// �ɶ����ݳ���
		size_t readable = readableBytes();
		// std::copy(begin() + m_readerIndex, begin() + m_writerIndex, begin() + m_nCheapPrepend);
		char* pDst = begin() + m_nCheapPrepend;
		char* pSrc = begin() + m_readerIndex;
		size_t writeSize = m_writerIndex - m_readerIndex;
		memmove(pDst, pSrc, writeSize);
		m_readerIndex = m_nCheapPrepend;
		m_writerIndex = m_readerIndex + readable;
		assert(readable == readableBytes());
	}